

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

void __thiscall
PhyloTree::PhyloTree(PhyloTree *this,PhyloTree *other,vector<int,_std::allocator<int>_> *missing)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  _Hash_node_base *p_Var1;
  pointer pbVar2;
  bool bVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  size_t sVar9;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> index_end;
  size_type num_bits;
  __node_base *p_Var10;
  size_t i;
  ulong uVar11;
  pointer this_00;
  long lVar12;
  size_type pos;
  double dVar13;
  reference rVar14;
  EdgeInfo info;
  vector<double,_std::allocator<double>_> pruned_lengths;
  bitset_t pruned;
  unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
  hashmap;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  name_indices;
  __node_base *local_1e0;
  int local_1c4;
  undefined1 local_1b0 [40];
  int local_188;
  bool local_184;
  _Vector_base<double,_std::allocator<double>_> local_168;
  vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *local_150;
  pointer local_148;
  string local_140;
  _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_120;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  
  (this->newick)._M_dataplus._M_p = (pointer)&(this->newick).field_2;
  (this->newick)._M_string_length = 0;
  (this->newick).field_2._M_local_buf[0] = '\0';
  local_150 = (vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *)&this->edges;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  local_168._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
  local_168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Tools::
  prune_container<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((other->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (other->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (missing->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (missing->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )&this->leaf2NumMap);
  index_end._M_current =
       (missing->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  Tools::
  prune_container<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             (other->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             (other->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (missing->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start,index_end,
             (vector<double,_std::allocator<double>_> *)&local_168);
  local_1b0._0_8_ = (_func_int **)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->leafEdgeLengths,
             (long)(this->leaf2NumMap).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->leaf2NumMap).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type_conflict *)local_1b0);
  poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG - pruned_names");
  std::endl<char,std::char_traits<char>>(poVar4);
  Tools::
  vector_print<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((this->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG - pruned_lengths");
  std::endl<char,std::char_traits<char>>(poVar4);
  Tools::
  vector_print<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_168._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_168._M_impl.super__Vector_impl_data._M_finish);
  poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG end");
  std::endl<char,std::char_traits<char>>(poVar4);
  local_e8._M_buckets = &local_e8._M_single_bucket;
  local_e8._M_bucket_count = 1;
  p_Var10 = &local_e8._M_before_begin;
  local_e8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e8._M_element_count = 0;
  local_e8._M_rehash_policy._M_max_load_factor = 1.0;
  local_e8._M_rehash_policy._M_next_resize = 0;
  local_e8._M_single_bucket = (__node_base_ptr)0x0;
  lVar12 = 0;
  for (uVar11 = 0;
      pbVar2 = (this->leaf2NumMap).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar11 < (ulong)((long)(this->leaf2NumMap).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
      uVar11 = uVar11 + 1) {
    pmVar5 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&local_e8,(key_type *)((long)&(pbVar2->_M_dataplus)._M_p + lVar12));
    *pmVar5 = uVar11;
    lVar12 = lVar12 + 0x20;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG - name_indices");
  std::endl<char,std::char_traits<char>>(poVar4);
  while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)(p_Var10 + 1));
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG end");
  std::endl<char,std::char_traits<char>>(poVar4);
  local_120._M_buckets = &local_120._M_single_bucket;
  local_120._M_bucket_count = 1;
  local_1e0 = &local_120._M_before_begin;
  local_120._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_120._M_element_count = 0;
  local_120._M_rehash_policy._M_max_load_factor = 1.0;
  local_120._M_rehash_policy._M_next_resize = 0;
  local_120._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = (other->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
            .super__Vector_impl_data._M_start;
  local_148 = (other->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_1c4 = 0;
  for (; this_00 != local_148; this_00 = this_00 + 1) {
    Bipartition::getPartition
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b0,
               &this_00->super_Bipartition);
    Tools::prune_bitset<std::vector<int,std::allocator<int>>>
              ((bitset_t *)&local_140,(Tools *)local_1b0,(bitset_t *)missing,
               (vector<int,_std::allocator<int>_> *)index_end._M_current);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b0);
    poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG - edge = ");
    (**(this_00->super_Bipartition)._vptr_Bipartition)((EdgeInfo *)local_1b0,this_00);
    poVar4 = std::operator<<(poVar4,(string *)local_1b0);
    poVar4 = std::operator<<(poVar4," pruned = ");
    pbVar6 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar4,
                               (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &local_140);
    std::endl<char,std::char_traits<char>>((ostream *)pbVar6);
    std::__cxx11::string::~string((string *)local_1b0);
    iVar7 = std::
            _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&local_120,(key_type *)&local_140);
    if (iVar7.
        super__Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
        ._M_cur == (__node_type *)0x0) {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b0,
                 (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_140);
      iVar7 = std::
              _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_120,(key_type *)local_1b0);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b0);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
          ._M_cur == (__node_type *)0x0) {
        EdgeInfo::EdgeInfo((EdgeInfo *)local_1b0);
        local_1b0._0_8_ = PhyloTreeEdge::getLength(this_00);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                  (&local_b0,
                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_140);
        bVar3 = Tools::is_leaf(&local_b0);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                  (&local_b0);
        if (bVar3) {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                    (&local_50,
                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_140);
          sVar9 = Tools::leaf_index_nothrow(&local_50);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                    (&local_50);
          std::__cxx11::string::_M_assign((string *)(local_1b0 + 8));
          local_1b0._0_8_ =
               local_168._M_impl.super__Vector_impl_data._M_start[sVar9] + (double)local_1b0._0_8_;
          local_184 = true;
        }
        else {
          local_188 = local_1c4;
          local_1c4 = local_1c4 + 1;
        }
        pmVar8 = std::__detail::
                 _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_120,(key_type *)&local_140);
        EdgeInfo::operator=(pmVar8,(EdgeInfo *)local_1b0);
        poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG - adding hashmap[");
        pbVar6 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar4,
                                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &local_140);
        std::operator<<((ostream *)pbVar6,"] = {");
        poVar4 = std::ostream::_M_insert<double>((double)local_1b0._0_8_);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::operator<<(poVar4,(string *)(local_1b0 + 8));
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_188);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
        poVar4 = std::operator<<(poVar4,"}");
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG end");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)(local_1b0 + 8));
      }
      else {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b0,
                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_140);
        pmVar8 = std::__detail::
                 _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_120,(key_type *)local_1b0);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b0);
        dVar13 = PhyloTreeEdge::getLength(this_00);
        pmVar8->length = dVar13 + pmVar8->length;
        poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG - altering hashmap[");
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b0,
                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_140);
        pbVar6 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar4,
                                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   local_1b0);
        std::operator<<((ostream *)pbVar6,"] = {");
        poVar4 = std::ostream::_M_insert<double>(pmVar8->length);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::operator<<(poVar4,(string *)&pmVar8->name);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pmVar8->id);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
        poVar4 = std::operator<<(poVar4,"} (complement)");
        std::endl<char,std::char_traits<char>>(poVar4);
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b0);
        poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG end");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    else {
      pmVar8 = std::__detail::
               _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_120,(key_type *)&local_140);
      dVar13 = PhyloTreeEdge::getLength(this_00);
      pmVar8->length = dVar13 + pmVar8->length;
      poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG - altering hashmap[");
      pbVar6 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar4,
                                 (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &local_140);
      std::operator<<((ostream *)pbVar6,"] = {");
      poVar4 = std::ostream::_M_insert<double>(pmVar8->length);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,(string *)&pmVar8->name);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pmVar8->id);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
      poVar4 = std::operator<<(poVar4,"}");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG end");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_140);
  }
  num_bits = (long)(this->leaf2NumMap).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->leaf2NumMap).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
  pos = num_bits;
  while (pos = pos - 1, pos != 0xffffffffffffffff) {
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_140,num_bits,
               0,(allocator<unsigned_long> *)local_1b0);
    rVar14 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_140,
                        pos);
    *rVar14.m_block = *rVar14.m_block | rVar14.m_mask;
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              (&local_70,(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_140
              );
    sVar9 = Tools::leaf_index_nothrow(&local_70);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_70)
    ;
    iVar7 = std::
            _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&local_120,(key_type *)&local_140);
    if (iVar7.
        super__Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
        ._M_cur == (__node_type *)0x0) {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b0,
                 (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_140);
      iVar7 = std::
              _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_120,(key_type *)local_1b0);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b0);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
          ._M_cur == (__node_type *)0x0) {
        EdgeInfo::EdgeInfo((EdgeInfo *)local_1b0);
        std::__cxx11::string::_M_assign((string *)(local_1b0 + 8));
        local_1b0._0_8_ = local_168._M_impl.super__Vector_impl_data._M_start[sVar9];
        local_184 = true;
        pmVar8 = std::__detail::
                 _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_120,(key_type *)&local_140);
        EdgeInfo::operator=(pmVar8,(EdgeInfo *)local_1b0);
        poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG - adding leaf hashmap[");
        pbVar6 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar4,
                                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &local_140);
        std::operator<<((ostream *)pbVar6,"] = {");
        poVar4 = std::ostream::_M_insert<double>((double)local_1b0._0_8_);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::operator<<(poVar4,(string *)(local_1b0 + 8));
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_188);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
        poVar4 = std::operator<<(poVar4,"}");
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG end");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)(local_1b0 + 8));
      }
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_140);
  }
  while (local_1e0 = local_1e0->_M_nxt, local_1e0 != (__node_base *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG - hashmap key: ");
    b = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)(local_1e0 + 1);
    pbVar6 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar4,b);
    std::operator<<((ostream *)pbVar6,", value: {");
    poVar4 = std::ostream::_M_insert<double>((double)local_1e0[5]._M_nxt);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = std::operator<<(poVar4,(string *)(local_1e0 + 6));
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)&local_1e0[10]._M_nxt);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    poVar4 = std::operator<<(poVar4,"}");
    std::endl<char,std::char_traits<char>>(poVar4);
    p_Var1 = local_1e0 + 5;
    if (*(char *)((long)&local_1e0[10]._M_nxt + 4) == '\x01') {
      p_Var1 = p_Var1->_M_nxt;
      pmVar5 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_e8,(key_type *)(local_1e0 + 6));
      (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[*pmVar5] = (double)p_Var1;
    }
    else {
      bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::all(b);
      if (!bVar3) {
        bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::none(b);
        if (!bVar3) {
          std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
          emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const&,double&,int&>
                    (local_150,b,(double *)p_Var1,(int *)(local_1e0 + 10));
        }
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG - PhyloTreeEdge check");
      std::endl<char,std::char_traits<char>>(poVar4);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_90,b);
      PhyloTreeEdge::PhyloTreeEdge
                ((PhyloTreeEdge *)local_1b0,&local_90,(double)p_Var1->_M_nxt,
                 *(int *)&local_1e0[10]._M_nxt);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                (&local_90);
      PhyloTreeEdge::toString_abi_cxx11_(&local_140,(PhyloTreeEdge *)local_1b0);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_140);
      std::operator<<(poVar4," ");
      dVar13 = PhyloTreeEdge::getLength((PhyloTreeEdge *)local_1b0);
      poVar4 = std::ostream::_M_insert<double>(dVar13);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&local_140);
      poVar4 = std::operator<<((ostream *)&std::cout,"DEBUG end");
      std::endl<char,std::char_traits<char>>(poVar4);
      PhyloTreeEdge::~PhyloTreeEdge((PhyloTreeEdge *)local_1b0);
    }
  }
  std::
  _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_120);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_e8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_168);
  return;
}

Assistant:

PhyloTree::PhyloTree(const PhyloTree& other, const vector<int>& missing)
{
    vector<double> pruned_lengths;  // temp store relevant edge lengths from other tree

    // TODO: combine these into a single loop
    Tools::prune_container(other.leaf2NumMap.begin(), other.leaf2NumMap.end(),
            missing.begin(), missing.end(), std::back_inserter(this->leaf2NumMap)); // fill pruned leaf2NumMap
    Tools::prune_container(other.leafEdgeLengths.begin(), other.leafEdgeLengths.end(),
            missing.begin(), missing.end(), std::back_inserter(pruned_lengths)); // fill temp lengths store

    this->leafEdgeLengths.resize(this->leaf2NumMap.size(), 0); // initialise leaf lengths vector

#ifdef DEBUGPRINT
    cout << "DEBUG - pruned_names" << endl;
    Tools::vector_print(this->leaf2NumMap.begin(), this->leaf2NumMap.end());

    cout << "DEBUG - pruned_lengths" << endl;
    Tools::vector_print(pruned_lengths.begin(), pruned_lengths.end());
    cout << "DEBUG end" << endl;
#endif

    std::unordered_map<string, size_t> name_indices;
    for (size_t i = 0; i<this->leaf2NumMap.size(); i++) {
        name_indices[this->leaf2NumMap[i]] = i;
    }
#ifdef DEBUGPRINT
    cout << "DEBUG - name_indices" << endl;
    for (auto& item: name_indices) {
        cout << item.first << " " << item.second << endl;
    }
    cout << "DEBUG end" << endl;
#endif

    std::unordered_map<bitset_t, EdgeInfo, BitsetHash> hashmap;
    int inner_edge_counter = 0;
    for (auto& edge: other.edges) {
        auto pruned = Tools::prune_bitset(edge.getPartition(), missing);

#ifdef DEBUGPRINT
        auto edge_copy = &edge;
        cout << "DEBUG - edge = " << const_cast<PhyloTreeEdge*>(edge_copy)->toString() << " pruned = " << pruned
                << endl;
#endif


        if (hashmap.find(pruned)==hashmap.end()) {
            if (hashmap.find(~pruned)==hashmap.end()) {
                EdgeInfo info;
                info.length = edge.getLength();
                if (Tools::is_leaf(pruned)) {
                    size_t ix = Tools::leaf_index_nothrow(pruned);
                    info.name = this->leaf2NumMap[ix];
                    info.length += pruned_lengths[ix];
                    info.leaf = true;
                }
                else {
                    info.id = inner_edge_counter++;
                }
                hashmap[pruned] = info;
#ifdef DEBUGPRINT
                cout << "DEBUG - adding hashmap[" << pruned << "] = {" << info.length << ", " << info.name
                        << ", " << info.id << ", " << info.leaf << "}" << endl;
                cout << "DEBUG end" << endl;
#endif
            }
            else {
                auto& info = hashmap[~pruned];
                info.length += edge.getLength();
#ifdef DEBUGPRINT
                cout << "DEBUG - altering hashmap[" << ~pruned << "] = {" << info.length << ", " << info.name
                        << ", " << info.id << ", " << info.leaf << "} (complement)" << endl;
                cout << "DEBUG end" << endl;
#endif
            }
        }
        else {
            auto& info = hashmap[pruned];
            info.length += edge.getLength();
#ifdef DEBUGPRINT
            cout << "DEBUG - altering hashmap[" << pruned << "] = {" << info.length << ", " << info.name
                    << ", " << info.id << ", " << info.leaf << "}" << endl;
            cout << "DEBUG end" << endl;
#endif
        }
    }
    // Add remaining leaves
    size_t size = this->leaf2NumMap.size();
    for (size_t i=0; i < size; ++i) {
        bitset_t leaf_split(size);
        leaf_split[size - i - 1] = true;
        size_t index = Tools::leaf_index_nothrow(leaf_split);
        if (hashmap.find(leaf_split)==hashmap.end() && hashmap.find(~leaf_split)==hashmap.end()) {
            EdgeInfo info;
            info.name = this->leaf2NumMap[index];
            info.length = pruned_lengths[index];
            info.leaf = true;
            hashmap[leaf_split] = info;
#ifdef DEBUGPRINT
            cout << "DEBUG - adding leaf hashmap[" << leaf_split << "] = {" << info.length << ", " << info.name
                    << ", " << info.id << ", " << info.leaf << "}" << endl;
            cout << "DEBUG end" << endl;
#endif
        }
    }

    // All info to build this PhyloTree is in the hashmap
    for (auto& item : hashmap) {
#ifdef DEBUGPRINT
        cout << "DEBUG - hashmap key: " << item.first << ", value: {" << item.second.length << ", " << item.second.name
                << ", " << item.second.id << ", " << item.second.leaf << "}" << endl;
#endif
        if (item.second.leaf) {
            this->leafEdgeLengths[name_indices[item.second.name]] = item.second.length;
        }
        else {
            if (!item.first.all() && !item.first.none()) {
                this->edges.emplace_back(item.first, item.second.length, item.second.id);
            }
#ifdef DEBUGPRINT
            cout << "DEBUG - PhyloTreeEdge check" << endl;
            PhyloTreeEdge check(item.first, item.second.length, item.second.id);
            cout << check.toString() << " " << check.getLength() << endl;
            cout << "DEBUG end" << endl;
#endif
        }
    }
}